

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O1

ring_buffer_size_t
PaUtil_WriteRingBuffer(PaUtilRingBuffer *rbuf,void *data,ring_buffer_size_t elementCount)

{
  ring_buffer_size_t rVar1;
  void *data2;
  void *data1;
  ring_buffer_size_t size2;
  ring_buffer_size_t size1;
  void *local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  rVar1 = PaUtil_GetRingBufferWriteRegions
                    (rbuf,elementCount,&local_48,&local_38,&local_50,&local_40);
  memcpy(local_48,data,rbuf->elementSizeBytes * local_38);
  if (0 < local_40) {
    memcpy(local_50,(void *)((long)data + local_38 * rbuf->elementSizeBytes),
           local_40 * rbuf->elementSizeBytes);
  }
  rbuf->writeIndex = rbuf->writeIndex + rVar1 & rbuf->bigMask;
  return rVar1;
}

Assistant:

ring_buffer_size_t PaUtil_WriteRingBuffer( PaUtilRingBuffer *rbuf, const void *data, ring_buffer_size_t elementCount )
{
    ring_buffer_size_t size1, size2, numWritten;
    void *data1, *data2;
    numWritten = PaUtil_GetRingBufferWriteRegions( rbuf, elementCount, &data1, &size1, &data2, &size2 );
    if( size2 > 0 )
    {

        memcpy( data1, data, size1*rbuf->elementSizeBytes );
        data = ((char *)data) + size1*rbuf->elementSizeBytes;
        memcpy( data2, data, size2*rbuf->elementSizeBytes );
    }
    else
    {
        memcpy( data1, data, size1*rbuf->elementSizeBytes );
    }
    PaUtil_AdvanceRingBufferWriteIndex( rbuf, numWritten );
    return numWritten;
}